

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O0

void Throw(string *failureMessage,char *originator,char *sourceLocation)

{
  logic_error *this;
  string local_70 [48];
  string local_40 [32];
  char *local_20;
  char *sourceLocation_local;
  char *originator_local;
  string *failureMessage_local;
  
  local_20 = sourceLocation;
  sourceLocation_local = originator;
  originator_local = (char *)failureMessage;
  if (originator != (char *)0x0) {
    Fmt_abi_cxx11_((char *)local_40,"\n    Origin: %s",originator);
    std::__cxx11::string::operator+=((string *)failureMessage,local_40);
    std::__cxx11::string::~string(local_40);
  }
  if (local_20 != (char *)0x0) {
    Fmt_abi_cxx11_((char *)local_70,"\n    Source: %s",local_20);
    std::__cxx11::string::operator+=((string *)failureMessage,local_70);
    std::__cxx11::string::~string(local_70);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)failureMessage);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

[[noreturn]] inline void Throw(std::string failureMessage, const char* originator = nullptr, const char* sourceLocation = nullptr) {
    if (originator != nullptr) {
        failureMessage += Fmt("\n    Origin: %s", originator);
    }
    if (sourceLocation != nullptr) {
        failureMessage += Fmt("\n    Source: %s", sourceLocation);
    }

    throw std::logic_error(failureMessage);
}